

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  xml_node xVar1;
  unspecified_bool_type p_Var2;
  char in_DL;
  xml_node *in_RSI;
  undefined8 *in_RDI;
  bool bVar3;
  char_t *jname;
  xml_node_struct *j;
  char_t *next_segment;
  char_t *path_segment_end;
  char_t *path_segment;
  xml_node context;
  xml_node subsearch;
  xml_node *in_stack_ffffffffffffff88;
  xml_node local_60;
  char_t *local_58;
  xml_node_struct *local_50;
  xml_node_struct *local_48;
  xml_node *local_40;
  xml_node *local_38;
  xml_node *local_30;
  undefined7 in_stack_ffffffffffffffe0;
  xml_node local_8;
  
  if (*(char *)&in_RSI->_root == in_DL) {
    xVar1 = root(in_stack_ffffffffffffff88);
  }
  else {
    xVar1._root = (xml_node_struct *)*in_RDI;
  }
  local_30 = in_RSI;
  if (xVar1._root == (xml_node_struct *)0x0) {
    xml_node(&local_8);
    xVar1._root = local_8._root;
  }
  else {
    for (; *(char *)&local_30->_root == in_DL; local_30 = (xml_node *)((long)&local_30->_root + 1))
    {
    }
    local_38 = local_30;
    while( true ) {
      bVar3 = false;
      if (*(char *)&local_38->_root != '\0') {
        bVar3 = *(char *)&local_38->_root != in_DL;
      }
      if (!bVar3) break;
      local_38 = (xml_node *)((long)&local_38->_root + 1);
    }
    if (local_30 != local_38) {
      for (local_40 = local_38; *(char *)&local_40->_root == in_DL;
          local_40 = (xml_node *)((long)&local_40->_root + 1)) {
      }
      if ((*(char *)&local_30->_root == '.') &&
         ((xml_node *)((long)&local_30->_root + 1) == local_38)) {
        xVar1 = first_element_by_path
                          (in_RSI,(char_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                           (char_t)((ulong)xVar1._root >> 0x38));
      }
      else if ((*(char *)&local_30->_root == '.') &&
              ((*(char *)((long)&local_30->_root + 1) == '.' &&
               ((xml_node *)((long)&local_30->_root + 2) == local_38)))) {
        local_48 = (xml_node_struct *)parent(in_stack_ffffffffffffff88);
        xVar1 = first_element_by_path
                          (in_RSI,(char_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                           (char_t)((ulong)xVar1._root >> 0x38));
      }
      else {
        for (local_50 = (xVar1._root)->first_child; local_50 != (xml_node_struct *)0x0;
            local_50 = local_50->next_sibling) {
          local_58 = local_50->name;
          if ((local_58 != (char_t *)0x0) &&
             (bVar3 = impl::anon_unknown_0::strequalrange
                                (local_58,(char_t *)local_30,(long)local_38 - (long)local_30), bVar3
             )) {
            xml_node(&local_60,local_50);
            local_8 = first_element_by_path
                                (in_RSI,(char_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                                 (char_t)((ulong)xVar1._root >> 0x38));
            p_Var2 = operator_cast_to_function_pointer(&local_8);
            if (p_Var2 != (unspecified_bool_type)0x0) {
              return (xml_node)local_8._root;
            }
          }
        }
        xml_node(&local_8);
        xVar1._root = local_8._root;
      }
    }
  }
  local_8._root = xVar1._root;
  return (xml_node)local_8._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				const char_t* jname = j->name;
				if (jname && impl::strequalrange(jname, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}